

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_locate_nnodes(Integer g_a,Integer *lo,Integer *hi,Integer *np)

{
  short sVar1;
  short sVar2;
  long *in_RCX;
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Integer cnt;
  Integer thi [7];
  Integer tlo [7];
  Integer j;
  Integer chk;
  Integer nblocks;
  Integer _i_7;
  int _ndim_4;
  int _i_6;
  int _itmp_1;
  int _offset;
  int _ndim_3;
  int _i_5;
  int _index_3 [7];
  int _ndim_2;
  int _i_4;
  int _itmp;
  int _ndim_1;
  int _i_3;
  int _index_2 [7];
  int _ndim;
  int _i_2;
  Integer _dimpos_1;
  Integer _dimstart_1;
  Integer _dim_1;
  Integer _index_1;
  Integer _d_1;
  Integer _nb_1;
  Integer _loc_1;
  Integer _dimpos;
  Integer _dimstart;
  Integer _dim;
  Integer _index;
  Integer _d;
  Integer _nb;
  Integer _loc;
  Integer _factor;
  Integer _i_1;
  Integer _hi [7];
  Integer _lo [7];
  Integer _i;
  C_Integer *map_1;
  int b_1;
  int found_1;
  int candidate_1;
  C_Integer *map;
  int b;
  int found;
  int candidate;
  char err_string_1 [256];
  char err_string [256];
  Integer use_blocks;
  Integer elems;
  Integer ndim;
  Integer dpos;
  Integer d;
  Integer ga_handle;
  Integer i;
  Integer proc;
  int proc_subscript [7];
  int procB [7];
  int procT [7];
  long local_510;
  long local_508 [8];
  long local_4c8 [7];
  long local_490;
  long local_488;
  long local_480;
  long local_478;
  int local_470;
  int local_46c;
  int local_468;
  int local_464;
  int local_460;
  int local_45c;
  int local_458 [7];
  int local_43c;
  int local_438;
  int local_434;
  int local_430;
  int local_42c;
  int local_428 [10];
  int local_400;
  int local_3fc;
  long local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  long local_3c8;
  long local_3c0;
  long local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  long local_380;
  Integer in_stack_fffffffffffffc88;
  char *in_stack_fffffffffffffc90;
  C_Integer aCStack_338 [7];
  long local_300;
  C_Integer *local_2f8;
  int local_2ec;
  uint local_2e8;
  int local_2e4;
  C_Integer *local_2e0;
  int local_2d4;
  uint local_2d0;
  int local_2cc;
  char local_2c8 [192];
  Integer *in_stack_fffffffffffffdf8;
  Integer *in_stack_fffffffffffffe00;
  Integer in_stack_fffffffffffffe08;
  Integer in_stack_fffffffffffffe10;
  char local_1c8 [264];
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  long local_a0;
  long local_98;
  long local_90;
  int aiStack_88 [8];
  int aiStack_68 [8];
  int aiStack_48 [8];
  long *local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_1c8,"%s: INVALID ARRAY HANDLE","nga_locate_nnodes");
    pnga_error(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  if (GA[local_10 + 1000].actv == 0) {
    sprintf(local_2c8,"%s: ARRAY NOT ACTIVE","nga_locate_nnodes");
    pnga_error(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
  }
  local_a0 = local_10 + 1000;
  for (local_a8 = 0; local_a8 < GA[local_a0].ndim; local_a8 = local_a8 + 1) {
    if (((*(long *)(local_18 + local_a8 * 8) < 1) ||
        (GA[local_a0].dims[local_a8] < *(long *)(local_20 + local_a8 * 8))) ||
       (*(long *)(local_20 + local_a8 * 8) < *(long *)(local_18 + local_a8 * 8))) {
      return 0;
    }
  }
  sVar1 = GA[local_a0].ndim;
  local_b8 = (long)sVar1;
  if (GA[local_a0].distr_type == 0) {
    local_b0 = 0;
    for (local_a8 = 0; local_a8 < GA[local_a0].ndim; local_a8 = local_a8 + 1) {
      local_2e0 = GA[local_a0].mapc + local_b0;
      local_2cc = (int)(GA[local_a0].scale[local_a8] * (double)*(long *)(local_18 + local_a8 * 8));
      if (local_2cc == GA[local_a0].nblock[local_a8]) {
        local_2cc = GA[local_a0].nblock[local_a8] + -1;
      }
      local_2d0 = 0;
      if (*(long *)(local_18 + local_a8 * 8) < local_2e0[local_2cc]) {
        local_2d4 = local_2cc + -1;
        while ((-1 < local_2d4 &&
               (local_2d0 = (uint)(local_2e0[local_2d4] <= *(long *)(local_18 + local_a8 * 8)),
               local_2d0 == 0))) {
          local_2d4 = local_2d4 + -1;
        }
      }
      else {
        local_2d4 = local_2cc;
        while ((local_2d4 < GA[local_a0].nblock[local_a8] + -1 &&
               (local_2d0 = (uint)(*(long *)(local_18 + local_a8 * 8) < local_2e0[local_2d4 + 1]),
               local_2d0 == 0))) {
          local_2d4 = local_2d4 + 1;
        }
      }
      if (local_2d0 == 0) {
        local_2d4 = GA[local_a0].nblock[local_a8] + -1;
      }
      aiStack_48[local_a8] = local_2d4;
      local_b0 = GA[local_a0].nblock[local_a8] + local_b0;
    }
    local_b0 = 0;
    for (local_a8 = 0; local_a8 < GA[local_a0].ndim; local_a8 = local_a8 + 1) {
      local_2f8 = GA[local_a0].mapc + local_b0;
      local_2e4 = (int)(GA[local_a0].scale[local_a8] * (double)*(long *)(local_20 + local_a8 * 8));
      if (local_2e4 == GA[local_a0].nblock[local_a8]) {
        local_2e4 = GA[local_a0].nblock[local_a8] + -1;
      }
      local_2e8 = 0;
      if (*(long *)(local_20 + local_a8 * 8) < local_2f8[local_2e4]) {
        local_2ec = local_2e4 + -1;
        while ((-1 < local_2ec &&
               (local_2e8 = (uint)(local_2f8[local_2ec] <= *(long *)(local_20 + local_a8 * 8)),
               local_2e8 == 0))) {
          local_2ec = local_2ec + -1;
        }
      }
      else {
        local_2ec = local_2e4;
        while ((local_2ec < GA[local_a0].nblock[local_a8] + -1 &&
               (local_2e8 = (uint)(*(long *)(local_20 + local_a8 * 8) < local_2f8[local_2ec + 1]),
               local_2e8 == 0))) {
          local_2ec = local_2ec + 1;
        }
      }
      if (local_2e8 == 0) {
        local_2ec = GA[local_a0].nblock[local_a8] + -1;
      }
      aiStack_68[local_a8] = local_2ec;
      local_b0 = GA[local_a0].nblock[local_a8] + local_b0;
    }
    *local_28 = 0;
    local_c0 = 1;
    for (local_300 = 0; local_300 < sVar1; local_300 = local_300 + 1) {
      local_c0 = ((aiStack_68[local_300] - aiStack_48[local_300]) + 1) * local_c0;
      aiStack_88[local_300] = aiStack_48[local_300];
    }
    for (local_98 = 0; local_98 < local_c0; local_98 = local_98 + 1) {
      local_388 = 1;
      local_90 = 0;
      for (local_380 = 0; local_380 < local_b8; local_380 = local_380 + 1) {
        local_90 = aiStack_88[local_380] * local_388 + local_90;
        if (local_380 < local_b8 + -1) {
          local_388 = GA[local_a0].nblock[local_380] * local_388;
        }
      }
      if (GA[local_a0].distr_type == 0) {
        if (GA[local_a0].num_rstrctd == 0) {
          local_3b0 = (long)GA[local_a0].ndim;
          local_3b8 = 0;
          local_398 = 1;
          for (local_3a0 = 0; local_3a0 < local_3b0; local_3a0 = local_3a0 + 1) {
            local_398 = GA[local_a0].nblock[local_3a0] * local_398;
          }
          if ((local_398 + -1 < local_90) || (local_90 < 0)) {
            for (local_3a0 = 0; local_3a0 < local_3b0; local_3a0 = local_3a0 + 1) {
              aCStack_338[local_3a0] = 0;
              *(undefined8 *)(&stack0xfffffffffffffc88 + local_3a0 * 8) = 0xffffffffffffffff;
            }
          }
          else {
            local_3a8 = local_90;
            for (local_3a0 = 0; local_3a0 < local_3b0; local_3a0 = local_3a0 + 1) {
              local_390 = local_3a8 % (long)GA[local_a0].nblock[local_3a0];
              local_3a8 = local_3a8 / (long)GA[local_a0].nblock[local_3a0];
              local_3c0 = local_390 + local_3b8;
              local_3b8 = GA[local_a0].nblock[local_3a0] + local_3b8;
              aCStack_338[local_3a0] = GA[local_a0].mapc[local_3c0];
              if (local_390 == GA[local_a0].nblock[local_3a0] + -1) {
                *(C_Integer *)(&stack0xfffffffffffffc88 + local_3a0 * 8) =
                     GA[local_a0].dims[local_3a0];
              }
              else {
                *(C_Integer *)(&stack0xfffffffffffffc88 + local_3a0 * 8) =
                     GA[local_a0].mapc[local_3c0 + 1] + -1;
              }
            }
          }
        }
        else if (local_90 < GA[local_a0].num_rstrctd) {
          local_3e8 = (long)GA[local_a0].ndim;
          local_3f0 = 0;
          local_3d0 = 1;
          for (local_3d8 = 0; local_3d8 < local_3e8; local_3d8 = local_3d8 + 1) {
            local_3d0 = GA[local_a0].nblock[local_3d8] * local_3d0;
          }
          if ((local_3d0 + -1 < local_90) || (local_90 < 0)) {
            for (local_3d8 = 0; local_3d8 < local_3e8; local_3d8 = local_3d8 + 1) {
              aCStack_338[local_3d8] = 0;
              *(undefined8 *)(&stack0xfffffffffffffc88 + local_3d8 * 8) = 0xffffffffffffffff;
            }
          }
          else {
            local_3e0 = local_90;
            for (local_3d8 = 0; local_3d8 < local_3e8; local_3d8 = local_3d8 + 1) {
              local_3c8 = local_3e0 % (long)GA[local_a0].nblock[local_3d8];
              local_3e0 = local_3e0 / (long)GA[local_a0].nblock[local_3d8];
              local_3f8 = local_3c8 + local_3f0;
              local_3f0 = GA[local_a0].nblock[local_3d8] + local_3f0;
              aCStack_338[local_3d8] = GA[local_a0].mapc[local_3f8];
              if (local_3c8 == GA[local_a0].nblock[local_3d8] + -1) {
                *(C_Integer *)(&stack0xfffffffffffffc88 + local_3d8 * 8) =
                     GA[local_a0].dims[local_3d8];
              }
              else {
                *(C_Integer *)(&stack0xfffffffffffffc88 + local_3d8 * 8) =
                     GA[local_a0].mapc[local_3f8 + 1] + -1;
              }
            }
          }
        }
        else {
          sVar1 = GA[local_a0].ndim;
          local_400 = (int)sVar1;
          for (local_3fc = 0; local_3fc < sVar1; local_3fc = local_3fc + 1) {
            aCStack_338[local_3fc] = 0;
            *(undefined8 *)(&stack0xfffffffffffffc88 + (long)local_3fc * 8) = 0xffffffffffffffff;
          }
        }
      }
      else {
        local_434 = (int)local_90;
        if (((GA[local_a0].distr_type == 1) || (GA[local_a0].distr_type == 2)) ||
           (GA[local_a0].distr_type == 3)) {
          sVar1 = GA[local_a0].ndim;
          local_430 = (int)sVar1;
          sVar2 = GA[local_a0].ndim;
          local_43c = (int)sVar2;
          local_428[0] = (int)((long)local_434 % GA[local_a0].num_blocks[0]);
          for (local_438 = 1; local_438 < sVar2; local_438 = local_438 + 1) {
            local_434 = (int)((long)(local_434 - local_428[local_438 + -1]) /
                             GA[local_a0].num_blocks[local_438 + -1]);
            local_428[local_438] = (int)((long)local_434 % GA[local_a0].num_blocks[local_438]);
          }
          for (local_42c = 0; local_42c < sVar1; local_42c = local_42c + 1) {
            aCStack_338[local_42c] =
                 (long)local_428[local_42c] * GA[local_a0].block_dims[local_42c] + 1;
            *(long *)(&stack0xfffffffffffffc88 + (long)local_42c * 8) =
                 (long)(local_428[local_42c] + 1) * GA[local_a0].block_dims[local_42c];
            if (GA[local_a0].dims[local_42c] <
                *(long *)(&stack0xfffffffffffffc88 + (long)local_42c * 8)) {
              *(C_Integer *)(&stack0xfffffffffffffc88 + (long)local_42c * 8) =
                   GA[local_a0].dims[local_42c];
            }
          }
        }
        else if (GA[local_a0].distr_type == 4) {
          sVar1 = GA[local_a0].ndim;
          local_460 = (int)sVar1;
          local_464 = 0;
          sVar2 = GA[local_a0].ndim;
          local_470 = (int)sVar2;
          local_468 = local_434;
          local_458[0] = (int)((long)local_434 % GA[local_a0].num_blocks[0]);
          for (local_46c = 1; local_46c < sVar2; local_46c = local_46c + 1) {
            local_468 = (int)((long)(local_468 - local_458[local_46c + -1]) /
                             GA[local_a0].num_blocks[local_46c + -1]);
            local_458[local_46c] = (int)((long)local_468 % GA[local_a0].num_blocks[local_46c]);
          }
          for (local_45c = 0; local_45c < sVar1; local_45c = local_45c + 1) {
            aCStack_338[local_45c] = GA[local_a0].mapc[local_464 + local_458[local_45c]];
            if ((long)local_458[local_45c] < GA[local_a0].num_blocks[local_45c] + -1) {
              *(C_Integer *)(&stack0xfffffffffffffc88 + (long)local_45c * 8) =
                   GA[local_a0].mapc[local_464 + local_458[local_45c] + 1] + -1;
            }
            else {
              *(C_Integer *)(&stack0xfffffffffffffc88 + (long)local_45c * 8) =
                   GA[local_a0].dims[local_45c];
            }
            local_464 = local_464 + (int)GA[local_a0].num_blocks[local_45c];
          }
        }
      }
      for (local_478 = 0; local_478 < local_b8; local_478 = local_478 + 1) {
        if (aiStack_88[local_478] < aiStack_68[local_478]) {
          aiStack_88[local_478] = aiStack_88[local_478] + 1;
          break;
        }
        aiStack_88[local_478] = aiStack_48[local_478];
      }
      *local_28 = *local_28 + 1;
    }
  }
  else {
    local_480 = GA[local_a0].block_total;
    local_510 = 0;
    for (local_98 = 0; local_98 < local_480; local_98 = local_98 + 1) {
      local_488 = 1;
      pnga_distribution(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                        in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      for (local_490 = 0; local_490 < local_b8 && local_488 == 1; local_490 = local_490 + 1) {
        if (((local_4c8[local_490] < *(long *)(local_18 + local_490 * 8)) ||
            (*(long *)(local_20 + local_490 * 8) < local_4c8[local_490])) &&
           ((local_508[local_490] < *(long *)(local_18 + local_490 * 8) ||
            (*(long *)(local_20 + local_490 * 8) < local_508[local_490])))) {
          local_488 = 0;
        }
      }
      if (local_488 != 0) {
        local_510 = local_510 + 1;
      }
    }
    *local_28 = local_510;
  }
  return 1;
}

Assistant:

logical pnga_locate_nnodes( Integer g_a,
                                 Integer *lo,
                                 Integer *hi,
                                 Integer *np)
/*    g_a      [input]  global array handle
      lo       [input]  lower indices of patch in global array
      hi       [input]  upper indices of patch in global array
      np       [output] total number of processors containing a portion
                        of the patch

      For a block cyclic data distribution, this function returns a list of
      blocks that cover the region along with the lower and upper indices of
      each block.
*/
{
  int  procT[MAXDIM], procB[MAXDIM], proc_subscript[MAXDIM];
  Integer  proc, i, ga_handle;
  Integer  d, dpos, ndim, elems, use_blocks;
  /* Integer  p_handle; */

  ga_check_handleM(g_a, "nga_locate_nnodes");

  ga_handle = GA_OFFSET + g_a;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))return FALSE;

  ndim = GA[ga_handle].ndim;

  if (GA[ga_handle].distr_type == REGULAR) {
    /* find "processor coordinates" for the top left corner and store them
     * in ProcT */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], lo[d], &procT[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    /* find "processor coordinates" for the right bottom corner and store
     * them in procB */

    for(d = 0, dpos = 0; d< GA[ga_handle].ndim; d++){
      findblock(GA[ga_handle].mapc + dpos, GA[ga_handle].nblock[d], 
          GA[ga_handle].scale[d], hi[d], &procB[d]);
      dpos += GA[ga_handle].nblock[d];
    }

    *np = 0;

    /* Find total number of processors containing data and return the
     * result in elems. Also find the lowest "processor coordinates" of the
     * processor block containing data and return these in proc_subscript.
     */
    ga_InitLoopM(&elems, ndim, proc_subscript, procT,procB,GA[ga_handle].nblock);

    /* p_handle = (Integer)GA[ga_handle].p_handle; */
    for(i= 0; i< elems; i++){ 
      Integer _lo[MAXDIM], _hi[MAXDIM];

      /* convert i to owner processor id using the current values in
         proc_subscript */
      ga_ComputeIndexM(&proc, ndim, proc_subscript, GA[ga_handle].nblock); 
      /* get range of global array indices that are owned by owner */
      ga_ownsM(ga_handle, proc, _lo, _hi);

      /* Update to proc_subscript so that it corresponds to the next
       * processor in the block of processors containing the patch */
      ga_UpdateSubscriptM(ndim,proc_subscript,procT,procB,GA[ga_handle].nblock);
      (*np)++;
    }
  } else {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, j, tlo[MAXDIM], thi[MAXDIM], cnt;
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }
      /* store blocks that overlap request region in proclist */
      if (chk) {
        cnt++;
      }
    }
    *np = cnt;
  }
  return(TRUE);
}